

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GameEngine.cpp
# Opt level: O2

int choosePlayerNumber(int minPlayers,int maxPlayers)

{
  undefined8 in_RAX;
  ostream *poVar1;
  undefined8 uStack_38;
  int playerChoice;
  
  uStack_38 = in_RAX;
  do {
    poVar1 = std::operator<<((ostream *)&std::cout,"please choose a number of players between ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,2);
    poVar1 = std::operator<<(poVar1," and ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,minPlayers);
    std::operator<<(poVar1," :\n");
    std::istream::operator>>((istream *)&std::cin,&playerChoice);
    std::ios::clear((int)*(undefined8 *)(std::cin + -0x18) + 0x13c520);
    std::istream::ignore((long)&std::cin,0x200);
  } while (minPlayers < playerChoice || playerChoice < 2);
  return playerChoice;
}

Assistant:

static int choosePlayerNumber(int minPlayers, int maxPlayers) {
    int playerChoice;
    do {
        cout << "please choose a number of players between " << minPlayers << " and " << maxPlayers << " :\n";
        cin >> playerChoice;
        cin.clear();
        cin.ignore(512, '\n');
    } while (playerChoice < minPlayers || playerChoice > maxPlayers || isnan(playerChoice));
    return int(playerChoice);
}